

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O2

CommonTableExpressionMap *
duckdb::CommonTableExpressionMap::Deserialize
          (CommonTableExpressionMap *__return_storage_ptr__,Deserializer *deserializer)

{
  CommonTableExpressionMap(__return_storage_ptr__);
  Deserializer::
  ReadPropertyWithDefault<duckdb::InsertionOrderPreservingMap<duckdb::unique_ptr<duckdb::CommonTableExpressionInfo,std::default_delete<duckdb::CommonTableExpressionInfo>,true>>>
            (deserializer,100,"map",&__return_storage_ptr__->map);
  return __return_storage_ptr__;
}

Assistant:

CommonTableExpressionMap CommonTableExpressionMap::Deserialize(Deserializer &deserializer) {
	CommonTableExpressionMap result;
	deserializer.ReadPropertyWithDefault<InsertionOrderPreservingMap<unique_ptr<CommonTableExpressionInfo>>>(100, "map", result.map);
	return result;
}